

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

void Utils::calculate_distances(void)

{
  Point *this;
  Point *p;
  bool bVar1;
  reference ppPVar2;
  double dVar3;
  Point *point2;
  iterator __end2;
  iterator __begin2;
  list<Point_*,_std::allocator<Point_*>_> *__range2;
  Point *point;
  iterator __end1;
  iterator __begin1;
  list<Point_*,_std::allocator<Point_*>_> *__range1;
  
  __end1 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::begin(&raw_rows_abi_cxx11_);
  point = (Point *)std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::end(&raw_rows_abi_cxx11_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&point);
    if (!bVar1) break;
    ppPVar2 = std::_List_iterator<Point_*>::operator*(&__end1);
    this = *ppPVar2;
    __end2 = std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::begin(&raw_rows_abi_cxx11_);
    point2 = (Point *)std::__cxx11::list<Point_*,_std::allocator<Point_*>_>::end
                                (&raw_rows_abi_cxx11_);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&point2);
      if (!bVar1) break;
      ppPVar2 = std::_List_iterator<Point_*>::operator*(&__end2);
      p = *ppPVar2;
      dVar3 = Point::distance(this,p);
      distances[this->id][p->id] = dVar3;
      std::_List_iterator<Point_*>::operator++(&__end2);
    }
    std::_List_iterator<Point_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Utils::calculate_distances() {
    for (Point *point: Utils::raw_rows) {
        for (Point *point2: Utils::raw_rows) {
            Utils::distances[point->id][point2->id] = point->distance(point2);
        }
    }
}